

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::tlru_cache(tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
             *this,size_t capacity,float max_load_factor)

{
  size_type sVar1;
  iterator iVar2;
  iterator __last;
  allocator<unsigned_long> local_2d [16];
  allocator<cappuccino::tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  local_1d;
  float local_1c;
  size_t sStack_18;
  float max_load_factor_local;
  size_t capacity_local;
  tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  local_1c = max_load_factor;
  sStack_18 = capacity;
  capacity_local = (size_t)this;
  mutex<(cappuccino::thread_safe)1,_std::mutex>::mutex(&this->m_lock);
  sVar1 = sStack_18;
  this->m_used_size = 0;
  std::
  allocator<cappuccino::tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  ::allocator(&local_1d);
  std::
  vector<cappuccino::tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
  ::vector(&this->m_elements,sVar1,&local_1d);
  std::
  allocator<cappuccino::tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  ::~allocator(&local_1d);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map(&this->m_keyed_elements);
  sVar1 = sStack_18;
  std::allocator<unsigned_long>::allocator(local_2d);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            (&this->m_lru_list,sVar1,local_2d);
  std::allocator<unsigned_long>::~allocator(local_2d);
  std::
  multimap<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_unsigned_long,_std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_unsigned_long>_>_>
  ::multimap(&this->m_ttl_list);
  std::_List_iterator<unsigned_long>::_List_iterator(&this->m_lru_end);
  iVar2 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    (&this->m_lru_list);
  __last = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->m_lru_list)
  ;
  std::iota<std::_List_iterator<unsigned_long>,int>
            ((_List_iterator<unsigned_long>)iVar2._M_node,
             (_List_iterator<unsigned_long>)__last._M_node,0);
  iVar2 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    (&this->m_lru_list);
  (this->m_lru_end)._M_node = iVar2._M_node;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::max_load_factor(&this->m_keyed_elements,local_1c);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::reserve(&this->m_keyed_elements,sStack_18);
  return;
}

Assistant:

explicit tlru_cache(size_t capacity, float max_load_factor = 1.0f) : m_elements(capacity), m_lru_list(capacity)
    {
        std::iota(m_lru_list.begin(), m_lru_list.end(), 0);
        m_lru_end = m_lru_list.begin();

        m_keyed_elements.max_load_factor(max_load_factor);
        m_keyed_elements.reserve(capacity);
    }